

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall kj::anon_unknown_123::PromisedAsyncIoStream::abortRead(PromisedAsyncIoStream *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  void *pvVar3;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_30;
  PromiseBase local_28;
  
  if ((this->stream).ptr.ptr != (AsyncIoStream *)0x0) {
    (*(((this->stream).ptr.ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[7])();
    return;
  }
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffd0);
  OVar2.ptr = local_30.ptr;
  pPVar1 = ((local_30.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_30.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&stack0xffffffffffffffd0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2472:42)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_0070c778;
    *(PromisedAsyncIoStream **)((long)pvVar3 + 0x3f8) = this;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_30.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_30.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&stack0xffffffffffffffd0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2472:42)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0070c778;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)this;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_28.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this_00;
  TaskSet::add(&this->tasks,(Promise<void> *)&stack0xffffffffffffffd8);
  OVar2.ptr = (PromiseNode *)local_28.node.ptr;
  if (local_28.node.ptr != (PromiseNode *)0x0) {
    local_28.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_30.ptr;
  if (&(local_30.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_30.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  return;
}

Assistant:

void abortRead() override {
    KJ_IF_SOME(s, stream) {
      return s->abortRead();
    } else {
      tasks.add(promise.addBranch().then([this]() {
        return KJ_ASSERT_NONNULL(stream)->abortRead();
      }));
    }
  }